

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O1

ExprBase * ResolveInitializerValue(ExpressionContext *ctx,SynBase *source,ExprBase *initializer)

{
  Allocator *pAVar1;
  char *dst;
  ArrayView<FunctionValue> functions;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  ExprBase *pEVar4;
  FunctionData *pFVar5;
  undefined4 extraout_var_01;
  ScopeData *pSVar6;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  TypeBase *pTVar7;
  size_t sVar8;
  TypeBase *pTVar9;
  char *pcVar10;
  TypeFunction *type;
  FunctionData *unaff_R12;
  bool bVar11;
  InplaceStr name;
  FunctionValue bestOverload;
  undefined4 uStack_34c;
  undefined1 local_348 [8];
  FunctionData *local_340;
  SynBase local_338 [12];
  Allocator *local_38;
  undefined4 extraout_var_00;
  
  if (initializer == (ExprBase *)0x0) {
    pcVar10 = "ERROR: auto variable must be initialized in place of definition";
  }
  else {
    type = (TypeFunction *)initializer->type;
    if (type == (TypeFunction *)ctx->typeVoid) {
      pcVar10 = "ERROR: r-value type is \'void\'";
    }
    else {
      if ((type == (TypeFunction *)0x0) || ((type->super_TypeBase).typeID != 0x15)) {
        type = (TypeFunction *)0x0;
      }
      if ((type != (TypeFunction *)0x0) &&
         (GetFunctionForType((FunctionValue *)local_348,ctx,initializer->source,initializer,type),
         unaff_R12 = local_340, local_340 != (FunctionData *)0x0)) {
        iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
        initializer = (ExprBase *)CONCAT44(extraout_var,iVar3);
        ExprFunctionAccess::ExprFunctionAccess
                  ((ExprFunctionAccess *)initializer,(SynBase *)local_348,
                   &local_340->type->super_TypeBase,local_340,(ExprBase *)local_338[0]._vptr_SynBase
                  );
      }
      bVar11 = false;
      if (*(int *)&((FunctionData *)initializer)->importModule == 0x27) {
        pTVar7 = ((FunctionData *)initializer)->contextType;
        if (pTVar7 == (TypeBase *)0x0) {
LAB_001fe3fc:
          pAVar1 = ctx->allocator;
          memset(local_338,0,0x300);
          local_340 = (FunctionData *)0x2000000000;
          local_348 = (undefined1  [8])local_338;
          local_38 = pAVar1;
          GetNodeFunctions(ctx,*(SynBase **)&((FunctionData *)initializer)->isInternal,initializer,
                           (SmallArray<FunctionValue,_32U> *)local_348);
          pcVar10 = ctx->errorBuf;
          if ((pcVar10 != (char *)0x0) && (ctx->errorBufSize != 0)) {
            if (ctx->errorCount == 0) {
              ctx->errorPos = (source->pos).begin;
              ctx->errorBufLocation = pcVar10;
            }
            dst = ctx->errorBufLocation;
            NULLC::SafeSprintf(dst,(ulong)(ctx->errorBufSize + ((int)pcVar10 - (int)dst)),
                               "ERROR: ambiguity, there is more than one overloaded function available:\n"
                              );
            pcVar10 = ctx->errorBufLocation;
            sVar8 = strlen(pcVar10);
            pcVar10 = pcVar10 + sVar8;
            ctx->errorBufLocation = pcVar10;
            functions.count = (uint)local_340;
            functions.data = (FunctionValue *)local_348;
            functions._12_4_ = uStack_34c;
            ReportOnFunctionSelectError
                      (ctx,source,pcVar10,
                       (*(int *)&ctx->errorBuf - (int)pcVar10) + ctx->errorBufSize,dst,functions);
            pcVar10 = ctx->errorBufLocation;
            sVar8 = strlen(pcVar10);
            ctx->errorBufLocation = pcVar10 + sVar8;
          }
          if (ctx->errorHandlerActive != false) {
            longjmp((__jmp_buf_tag *)ctx->errorHandler,1);
          }
          __assert_fail("ctx.errorHandlerActive",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/ExpressionTree.cpp"
                        ,0x20e0,
                        "ExprBase *ResolveInitializerValue(ExpressionContext &, SynBase *, ExprBase *)"
                       );
        }
        iVar3 = 1;
        pTVar9 = pTVar7;
        do {
          pTVar9 = *(TypeBase **)&pTVar9->typeID;
          iVar3 = iVar3 + -1;
        } while (pTVar9 != (TypeBase *)0x0);
        if (iVar3 != 0) goto LAB_001fe3fc;
        unaff_R12 = (FunctionData *)pTVar7->_vptr_TypeBase;
        bVar11 = unaff_R12->type->returnType == ctx->typeAuto;
        if (bVar11) {
          anon_unknown.dwarf_11255e::Report
                    (ctx,source,"ERROR: function type is unresolved at this point");
          iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
          unaff_R12 = (FunctionData *)CONCAT44(extraout_var_01,iVar3);
          pSVar6 = (ScopeData *)ExpressionContext::GetErrorType(ctx);
          *(undefined4 *)&unaff_R12->importModule = 0;
          *(SynBase **)&unaff_R12->isInternal = source;
          unaff_R12->scope = pSVar6;
          unaff_R12->coroutine = false;
          unaff_R12->accessor = false;
          unaff_R12->isOperator = false;
          *(undefined5 *)&unaff_R12->field_0x23 = 0;
          *(undefined1 *)&unaff_R12->type = 0;
          unaff_R12->source = (SynBase *)&PTR__ExprError_003f6638;
          (unaff_R12->aliases).head = (MatchData *)0x0;
          unaff_R12->contextType = (TypeBase *)&unaff_R12->nameHash;
          unaff_R12->name = (SynIdentifier *)0x400000000;
        }
        else {
          bVar2 = IsVirtualFunctionCall
                            (ctx,unaff_R12,
                             *(TypeBase **)
                              (*(long *)&((FunctionData *)initializer)->nameHash + 0x18));
          if (bVar2) {
            pEVar4 = GetFunctionTable(ctx,source,unaff_R12);
            name.end = "";
            name.begin = "__redirect_ptr";
            initializer = CreateFunctionCall2(ctx,source,name,
                                              *(ExprBase **)&((FunctionData *)initializer)->nameHash
                                              ,pEVar4,false,true,true);
            if (((FunctionData *)initializer == (FunctionData *)0x0) ||
               (*(uint *)&((FunctionData *)initializer)->importModule != 0)) {
              iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
              pFVar5 = (FunctionData *)CONCAT44(extraout_var_00,iVar3);
              pSVar6 = (ScopeData *)unaff_R12->type;
              *(uint *)&pFVar5->importModule = 0x12;
              *(SynBase **)&pFVar5->isInternal = source;
              pFVar5->scope = pSVar6;
              *(ExprBase **)&pFVar5->coroutine = (ExprBase *)0x0;
              *(bool *)&pFVar5->type = false;
              ((ExprBase *)&pFVar5->source)->_vptr_ExprBase = (_func_int **)&PTR__ExprBase_003f6478;
              pFVar5->contextType = (TypeBase *)initializer;
              *(undefined4 *)&pFVar5->name = 0xd;
              initializer = (ExprBase *)pFVar5;
            }
          }
          else {
            iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x40);
            ExprFunctionAccess::ExprFunctionAccess
                      ((ExprFunctionAccess *)CONCAT44(extraout_var_02,iVar3),
                       *(SynBase **)&((FunctionData *)initializer)->isInternal,
                       &unaff_R12->type->super_TypeBase,unaff_R12,
                       *(ExprBase **)&((FunctionData *)initializer)->nameHash);
            initializer = (ExprBase *)CONCAT44(extraout_var_02,iVar3);
          }
        }
      }
      if (bVar11) {
        return (ExprBase *)unaff_R12;
      }
      if ((*(uint *)&((FunctionData *)initializer)->importModule == 0x25) ||
         (*(bool *)((long)&((FunctionData *)initializer)->scope->startOffset + 4) == true)) {
        anon_unknown.dwarf_11255e::Stop
                  (ctx,source,
                   "ERROR: cannot instantiate generic function, because target type is not known");
      }
      if (*(uint *)&((FunctionData *)initializer)->importModule != 0x17) {
        return (ExprBase *)(FunctionData *)initializer;
      }
      pcVar10 = "ERROR: target type of an \'auto ref\' cast is unknown";
    }
  }
  anon_unknown.dwarf_11255e::Report(ctx,source,pcVar10);
  iVar3 = (*ctx->allocator->_vptr_Allocator[2])(ctx->allocator,0x68);
  pEVar4 = (ExprBase *)CONCAT44(extraout_var_03,iVar3);
  pTVar7 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
  pEVar4->typeID = 0;
  pEVar4->source = source;
  pEVar4->type = pTVar7;
  pEVar4->next = (ExprBase *)0x0;
  pEVar4->listed = false;
  pEVar4->_vptr_ExprBase = (_func_int **)&PTR__ExprError_003f6638;
  pEVar4[2]._vptr_ExprBase = (_func_int **)0x0;
  pEVar4[1]._vptr_ExprBase = (_func_int **)&pEVar4[1].source;
  *(undefined8 *)&pEVar4[1].typeID = 0x400000000;
  return pEVar4;
}

Assistant:

ExprBase* ResolveInitializerValue(ExpressionContext &ctx, SynBase *source, ExprBase *initializer)
{
	if(!initializer)
	{
		Report(ctx, source, "ERROR: auto variable must be initialized in place of definition");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(initializer->type == ctx.typeVoid)
	{
		Report(ctx, source, "ERROR: r-value type is 'void'");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	if(TypeFunction *target = getType<TypeFunction>(initializer->type))
	{
		if(FunctionValue bestOverload = GetFunctionForType(ctx, initializer->source, initializer, target))
			initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(bestOverload.source, bestOverload.function->type, bestOverload.function, bestOverload.context);
	}

	if(ExprFunctionOverloadSet *node = getType<ExprFunctionOverloadSet>(initializer))
	{
		if(node->functions.size() == 1)
		{
			FunctionData *function = node->functions.head->function;

			if(function->type->returnType == ctx.typeAuto)
			{
				Report(ctx, source, "ERROR: function type is unresolved at this point");

				return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
			}

			if(IsVirtualFunctionCall(ctx, function, node->context->type))
			{
				ExprBase *table = GetFunctionTable(ctx, source, function);

				initializer = CreateFunctionCall2(ctx, source, InplaceStr("__redirect_ptr"), node->context, table, false, true, true);

				if(!isType<TypeError>(initializer))
					initializer = new (ctx.get<ExprTypeCast>()) ExprTypeCast(source, function->type, initializer, EXPR_CAST_REINTERPRET);
			}
			else
			{
				initializer = new (ctx.get<ExprFunctionAccess>()) ExprFunctionAccess(initializer->source, function->type, function, node->context);
			}
		}
		else
		{
			SmallArray<FunctionValue, 32> functions(ctx.allocator);

			GetNodeFunctions(ctx, initializer->source, initializer, functions);

			if(ctx.errorBuf && ctx.errorBufSize)
			{
				if(ctx.errorCount == 0)
				{
					ctx.errorPos = source->pos.begin;
					ctx.errorBufLocation = ctx.errorBuf;
				}

				const char *messageStart = ctx.errorBufLocation;

				NULLC::SafeSprintf(ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), "ERROR: ambiguity, there is more than one overloaded function available:\n");

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);

				ReportOnFunctionSelectError(ctx, source, ctx.errorBufLocation, ctx.errorBufSize - unsigned(ctx.errorBufLocation - ctx.errorBuf), messageStart, functions);

				ctx.errorBufLocation += strlen(ctx.errorBufLocation);
			}

			assert(ctx.errorHandlerActive);

			longjmp(ctx.errorHandler, 1);
		}
	}

	if(isType<ExprGenericFunctionPrototype>(initializer) || initializer->type->isGeneric)
		Stop(ctx, source, "ERROR: cannot instantiate generic function, because target type is not known");

	if(isType<ExprUnboxing>(initializer))
	{
		Report(ctx, source, "ERROR: target type of an 'auto ref' cast is unknown");

		return new (ctx.get<ExprError>()) ExprError(source, ctx.GetErrorType());
	}

	return initializer;
}